

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

dtime_t __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,duckdb::dtime_t,duckdb::QuantileIndirect<duckdb::dtime_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::dtime_t> *accessor)

{
  RESULT_TYPE src;
  long in_RDX;
  long in_RSI;
  Vector *in_RDI;
  dtime_t hi;
  dtime_t lo;
  QuantileIndirect<duckdb::dtime_t> *in_stack_ffffffffffffff98;
  dtime_t *in_stack_ffffffffffffffa8;
  undefined8 local_8;
  
  if (in_RSI == in_RDX) {
    QuantileIndirect<duckdb::dtime_t>::operator()(in_stack_ffffffffffffff98,(INPUT_TYPE *)0xa96d02);
    local_8 = CastInterpolation::Cast<duckdb::dtime_t,duckdb::dtime_t>
                        (in_stack_ffffffffffffffa8,in_RDI);
  }
  else {
    QuantileIndirect<duckdb::dtime_t>::operator()(in_stack_ffffffffffffff98,(INPUT_TYPE *)0xa96d2f);
    CastInterpolation::Cast<duckdb::dtime_t,duckdb::dtime_t>(in_stack_ffffffffffffffa8,in_RDI);
    src = QuantileIndirect<duckdb::dtime_t>::operator()
                    (in_stack_ffffffffffffff98,(INPUT_TYPE *)0xa96d57);
    CastInterpolation::Cast<duckdb::dtime_t,duckdb::dtime_t>((dtime_t *)src.micros,in_RDI);
    local_8 = CastInterpolation::Interpolate<duckdb::dtime_t>
                        (src.micros,(double)in_RDI,(dtime_t *)in_stack_ffffffffffffff98);
  }
  return (dtime_t)local_8;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}